

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_mem xmrig::OclLib::createSubBuffer
                 (cl_mem buffer,cl_mem_flags flags,size_t offset,size_t size,cl_int *errcode_ret)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  cl_mem_flags in_RSI;
  cl_mem in_RDI;
  cl_int *in_R8;
  cl_mem result;
  cl_buffer_region region;
  undefined1 local_40 [16];
  int *local_30;
  undefined8 local_28;
  undefined8 local_20;
  cl_mem local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_8 = (*pCreateSubBuffer)(in_RDI,in_RSI,0x1220,local_40,in_R8);
  if (*local_30 != 0) {
    pcVar1 = ocl_tag();
    pcVar2 = OclError::toString(*local_30);
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m with offset \x1b[0m\x1b[1;31m%zu\x1b[0m\x1b[0;31m and size \x1b[0m\x1b[1;31m%zu\x1b[0m"
               ,pcVar1,pcVar2,kCreateSubBuffer,local_20,local_28);
    local_8 = (cl_mem)0x0;
  }
  return local_8;
}

Assistant:

cl_mem xmrig::OclLib::createSubBuffer(cl_mem buffer, cl_mem_flags flags, size_t offset, size_t size, cl_int *errcode_ret) noexcept
{
    const cl_buffer_region region = { offset, size };

    auto result = pCreateSubBuffer(buffer, flags, CL_BUFFER_CREATE_TYPE_REGION, &region, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("%s") RED(" with offset ") RED_BOLD("%zu") RED(" and size ") RED_BOLD("%zu"),
                ocl_tag(), OclError::toString(*errcode_ret), kCreateSubBuffer, offset, size);

        return nullptr;
    }

    return result;
}